

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::CullDistance::APICoverageTest::iterate(APICoverageTest *this)

{
  ostringstream *poVar1;
  GLuint *pGVar2;
  ostringstream *poVar3;
  GLuint GVar4;
  char *__s;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType CVar10;
  GLenum GVar11;
  undefined4 extraout_var;
  GLuint *pGVar12;
  _shader_body *p_Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  char *pcVar16;
  _Alloc_hider te_body_00;
  int *piVar17;
  GLuint *pGVar18;
  long lVar19;
  undefined8 uVar20;
  MessageBuilder *pMVar21;
  TestError *pTVar22;
  NotSupportedError *this_00;
  _Alloc_hider fs_body_00;
  char *pcVar23;
  _Alloc_hider cs_body_00;
  qpTestResult testResult;
  long lVar24;
  TestContext *this_01;
  _Alloc_hider gs_body_00;
  _Alloc_hider tc_body_00;
  _Alloc_hider vs_body_00;
  bool bVar25;
  _run *local_378;
  GLint result_value;
  long local_368;
  GLint gl_max_combined_clip_and_cull_distances_value;
  GLuint *local_358;
  uint local_350;
  GLint gl_max_cull_distances_value;
  GLuint *local_348;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  string cs_body;
  string vs_body;
  _shader_body shader_bodies [6];
  GLint clear_values [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [6];
  ios_base local_180 [264];
  _run runs [2];
  Functions *gl;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar9);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_cull_distance");
  if (!bVar6) {
    CVar10.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar6 = glu::contextSupports(CVar10,(ApiType)0x154);
    if (!bVar6) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      clear_values._0_8_ = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)clear_values,"GL_ARB_cull_distance is not supported","");
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)clear_values);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  gl_max_cull_distances_value = 0;
  gl_max_combined_clip_and_cull_distances_value = 0;
  (*gl->getIntegerv)(0x82f9,&gl_max_cull_distances_value);
  GVar11 = (*gl->getError)();
  if (GVar11 == 0) {
    (*gl->getIntegerv)(0x82fa,&gl_max_combined_clip_and_cull_distances_value);
    GVar11 = (*gl->getError)();
    if (GVar11 == 0) {
      (*gl->genBuffers)(1,&this->m_bo_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1dc);
      (*gl->genFramebuffers)(1,&this->m_fbo_draw_id);
      (*gl->genFramebuffers)(1,&this->m_fbo_read_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenFramebuffers() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e0);
      pGVar2 = &this->m_cs_to_id;
      (*gl->genTextures)(1,pGVar2);
      local_358 = &this->m_fbo_draw_to_id;
      (*gl->genTextures)(1,local_358);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e4);
      (*gl->genVertexArrays)(1,&this->m_vao_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenVertexArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e7);
      (*gl->bindVertexArray)(this->m_vao_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindVertexArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1ea);
      (*gl->bindBuffer)(0x8c8e,this->m_bo_id);
      (*gl->bindBufferBase)(0x8c8e,0,this->m_bo_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindBuffer() or glBindBufferBase() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1ef);
      (*gl->bufferData)(0x8c8e,0x40,(void *)0x0,0x88e4);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBufferData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1f2);
      bVar6 = true;
      do {
        bVar7 = bVar6;
        pGVar12 = local_358;
        if (bVar7) {
          pGVar12 = pGVar2;
        }
        (*gl->bindTexture)(0xde1,*pGVar12);
        GVar11 = (*gl->getError)();
        glu::checkError(GVar11,"glBindTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x1f7);
        (*gl->texStorage2D)(0xde1,1,0x8235,1,1);
        GVar11 = (*gl->getError)();
        glu::checkError(GVar11,"glTexStorage2D() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x1fc);
        bVar6 = false;
      } while (bVar7);
      (*gl->bindImageTexture)(0,this->m_cs_to_id,0,'\0',0,0x88b9,0x8235);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindImageTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x204);
      (*gl->bindFramebuffer)(0x8ca9,this->m_fbo_draw_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x207);
      (*gl->framebufferTexture2D)(0x8ca9,0x8ce0,0xde1,this->m_fbo_draw_to_id,0);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glFramebufferTexture2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x20a);
      (*gl->bindFramebuffer)(0x8ca8,this->m_fbo_read_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x20d);
      (*gl->viewport)(0,0,1,1);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glViewport() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x213);
      (*gl->pixelStorei)(0xd05,1);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glPixelStorei() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x216);
      local_378 = runs;
      runs[0].essl_token_value = "gl_MaxCullDistances";
      runs[0].gl_enum = 0x82f9;
      runs[0].gl_value = gl_max_cull_distances_value;
      runs[0].min_value = 8;
      runs[0].name = "GL_MAX_CULL_DISTANCES";
      runs[1].essl_token_value = "gl_MaxCombinedClipAndCullDistances";
      runs[1].gl_enum = 0x82fa;
      runs[1].gl_value = gl_max_combined_clip_and_cull_distances_value;
      runs[1].min_value = 8;
      runs[1].name = "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES";
      local_348 = &this->m_po_id;
      uVar20 = CONCAT71((int7)((ulong)local_348 >> 8),1);
      pGVar12 = local_358;
      do {
        local_350 = (uint)uVar20;
        lVar19 = 0;
        do {
          bVar6 = iterate::stages[lVar19].use_cs;
          if (bVar6 == true) {
            CVar10.super_ApiType.m_bits =
                 (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])
                                    ();
            bVar7 = glu::contextSupports(CVar10,(ApiType)0x134);
            if ((bVar7) ||
               (bVar7 = glu::ContextInfo::isExtensionSupported
                                  (((this->super_TestCase).m_context)->m_contextInfo,
                                   "GL_ARB_compute_shader"), bVar7)) goto LAB_0083ae82;
          }
          else {
LAB_0083ae82:
            bVar7 = iterate::stages[lVar19].use_tc;
            if ((bVar7 != false) || (iterate::stages[lVar19].use_te == true)) {
              CVar10.super_ApiType.m_bits =
                   (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext
                              [2])();
              bVar8 = glu::contextSupports(CVar10,(ApiType)0x104);
              if ((!bVar8) &&
                 (bVar8 = glu::ContextInfo::isExtensionSupported
                                    (((this->super_TestCase).m_context)->m_contextInfo,
                                     "GL_ARB_tessellation_shader"), !bVar8)) goto LAB_0083b786;
            }
            cs_body._M_dataplus._M_p = (pointer)&cs_body.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&cs_body,
                       "#version 150\n\n#extension GL_ARB_compute_shader          : require\n#extension GL_ARB_cull_distance           : require\n#extension GL_ARB_shader_image_load_store : require\n\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout(r32i) uniform writeonly iimage2D result;\n\nvoid main()\n{\n    imageStore(result, ivec2(0),ivec4(TOKEN) );\n}\n"
                       ,"");
            fs_body._M_dataplus._M_p = (pointer)&fs_body.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&fs_body,
                       "#version 150\n\n#extension GL_ARB_cull_distance : require\n\nflat in  int INPUT_FS_NAME;\nout int out_fs;\n\nvoid main()\n{\n    if (INPUT_FS_NAME == TOKEN)\n    {\n        out_fs = TOKEN;\n    }\n    else\n    {\n        out_fs = -1;\n    }\n}\n"
                       ,"");
            gs_body._M_dataplus._M_p = (pointer)&gs_body.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&gs_body,
                       "#version 150\n\n#extension GL_ARB_cull_distance : require\n\nflat in  int INPUT_GS_NAME[];\nflat out int out_gs;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    int result_value = (INPUT_GS_NAME[0] == TOKEN) ? TOKEN : -1;\n\n    gl_Position = vec4(-1.0, 1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n\n    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n\n    gl_Position = vec4(1.0, 1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n\n    gl_Position = vec4(1.0, -1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n    EndPrimitive();\n}\n"
                       ,"");
            tc_body._M_dataplus._M_p = (pointer)&tc_body.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&tc_body,
                       "#version 400\n\n#extension GL_ARB_cull_distance : require\n\nlayout(vertices = 1) out;\n\nflat in  int INPUT_TC_NAME[];\nflat out int out_tc       [];\n\nvoid main()\n{\n    int result_value = (INPUT_TC_NAME[0] == TOKEN) ? TOKEN : -1;\n\n    out_tc[gl_InvocationID]             = result_value;\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0]                = 1.0;\n    gl_TessLevelInner[1]                = 1.0;\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n    gl_TessLevelOuter[2]                = 1.0;\n    gl_TessLevelOuter[3]                = 1.0;\n}\n"
                       ,"");
            te_body._M_dataplus._M_p = (pointer)&te_body.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&te_body,
                       "#version 400\n\n#extension GL_ARB_cull_distance : require\n\nflat in  int INPUT_TE_NAME[];\nflat out int out_te;\n\nlayout(isolines, point_mode) in;\n\nvoid main()\n{\n    int result_value = (INPUT_TE_NAME[0] == TOKEN) ? TOKEN : 0;\n\n    out_te = result_value;\n\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.);\n}\n"
                       ,"");
            vs_body._M_dataplus._M_p = (pointer)&vs_body.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&vs_body,
                       "#version 150\n\n#extension GL_ARB_cull_distance : require\n\nflat out int out_vs;\n\nvoid main()\n{\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n    out_vs      = TOKEN;\n}\n"
                       ,"");
            shader_bodies[0].body_ptr = &cs_body;
            shader_bodies[0].gl_type = 0x91b9;
            shader_bodies[1].body_ptr = &fs_body;
            shader_bodies[1].gl_type = 0x8b30;
            shader_bodies[2].body_ptr = &gs_body;
            shader_bodies[2].gl_type = 0x8dd9;
            shader_bodies[3].body_ptr = &tc_body;
            shader_bodies[3].gl_type = 0x8e88;
            shader_bodies[4].body_ptr = &te_body;
            shader_bodies[4].gl_type = 0x8e87;
            shader_bodies[5].body_ptr = &vs_body;
            shader_bodies[5].gl_type = 0x8b31;
            lVar24 = 0;
            do {
              GVar11 = shader_bodies[lVar24].gl_type;
              if ((int)GVar11 < 0x8e87) {
                if (GVar11 == 0x8b30) {
                  if (iterate::stages[lVar19].use_fs == true) {
                    clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                    clear_values._8_8_ = local_378->essl_token_value;
                    local_1e8[0]._M_allocated_capacity = "INPUT_FS_NAME";
                    local_1e8[0]._8_8_ = iterate::stages[lVar19].fs_input;
                    goto LAB_0083b220;
                  }
                }
                else {
                  if (GVar11 == 0x8b31) {
                    if (iterate::stages[lVar19].use_vs != true) goto LAB_0083b2e0;
LAB_0083b0d6:
                    clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                    clear_values._8_8_ = local_378->essl_token_value;
                    local_1e8[0]._M_allocated_capacity = (char *)0x0;
                    local_1e8[0]._8_8_ = (GLchar *)0x0;
                  }
                  else {
LAB_0083b1dd:
                    clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                    clear_values._8_8_ = local_378->essl_token_value;
                    if (GVar11 != 0x8dd9) {
                      pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar22,"Unrecognized shader body type",(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                 ,0x379);
                      __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                    }
                    local_1e8[0]._M_allocated_capacity = "INPUT_GS_NAME";
                    local_1e8[0]._8_8_ = iterate::stages[lVar19].gs_input;
LAB_0083b220:
                  }
                  clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                  p_Var13 = shader_bodies + lVar24;
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)clear_values;
                  bVar8 = true;
                  local_368 = lVar24;
                  do {
                    bVar25 = bVar8;
                    pcVar23 = (char *)paVar14->_M_allocated_capacity;
                    if ((pcVar23 != (char *)0x0) &&
                       (__s = (char *)(&paVar14->_M_allocated_capacity)[1], __s != (char *)0x0)) {
                      psVar5 = p_Var13->body_ptr;
                      while( true ) {
                        strlen(pcVar23);
                        uVar15 = std::__cxx11::string::find((char *)psVar5,(ulong)pcVar23,0);
                        if (uVar15 == 0xffffffffffffffff) break;
                        pcVar16 = (char *)strlen(pcVar23);
                        strlen(__s);
                        std::__cxx11::string::replace((ulong)psVar5,uVar15,pcVar16,(ulong)__s);
                      }
                    }
                    paVar14 = local_1e8;
                    lVar24 = local_368;
                    pGVar12 = local_358;
                    bVar8 = false;
                  } while (bVar25);
                }
              }
              else if (GVar11 == 0x8e87) {
                if (iterate::stages[lVar19].use_te == true) {
                  clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                  clear_values._8_8_ = local_378->essl_token_value;
                  local_1e8[0]._M_allocated_capacity = "INPUT_TE_NAME";
                  local_1e8[0]._8_8_ = iterate::stages[lVar19].te_input;
                  goto LAB_0083b220;
                }
              }
              else if (GVar11 == 0x8e88) {
                if (bVar7 != false) {
                  clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                  clear_values._8_8_ = local_378->essl_token_value;
                  local_1e8[0]._M_allocated_capacity = "INPUT_TC_NAME";
                  local_1e8[0]._8_8_ = iterate::stages[lVar19].tc_input;
                  goto LAB_0083b220;
                }
              }
              else {
                if (GVar11 != 0x91b9) goto LAB_0083b1dd;
                if (bVar6 != false) goto LAB_0083b0d6;
              }
LAB_0083b2e0:
              pGVar18 = local_348;
              lVar24 = lVar24 + 1;
            } while (lVar24 != 6);
            cs_body_00._M_p = (GLchar *)0x0;
            if (bVar6 != false) {
              cs_body_00._M_p = cs_body._M_dataplus._M_p;
            }
            bVar8 = iterate::stages[lVar19].use_fs;
            fs_body_00._M_p = (GLchar *)0x0;
            if (bVar8 != false) {
              fs_body_00._M_p = fs_body._M_dataplus._M_p;
            }
            gs_body_00._M_p = (GLchar *)0x0;
            if (iterate::stages[lVar19].use_gs != false) {
              gs_body_00._M_p = gs_body._M_dataplus._M_p;
            }
            tc_body_00._M_p = (GLchar *)0x0;
            if (bVar7 != false) {
              tc_body_00._M_p = tc_body._M_dataplus._M_p;
            }
            te_body_00._M_p = (GLchar *)0x0;
            if (iterate::stages[lVar19].use_te != false) {
              te_body_00._M_p = te_body._M_dataplus._M_p;
            }
            vs_body_00._M_p = (GLchar *)0x0;
            if (iterate::stages[lVar19].use_vs != false) {
              vs_body_00._M_p = vs_body._M_dataplus._M_p;
            }
            clear_values[0] = (uint)(iterate::stages[lVar19].tf_output_name != (GLchar *)0x0);
            Utilities::buildProgram
                      (gl,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       cs_body_00._M_p,fs_body_00._M_p,gs_body_00._M_p,tc_body_00._M_p,
                       te_body_00._M_p,vs_body_00._M_p,(GLuint *)clear_values,
                       &iterate::stages[lVar19].tf_output_name,local_348);
            (*gl->useProgram)(*pGVar18);
            GVar11 = (*gl->getError)();
            glu::checkError(GVar11,"glUseProgram() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x398);
            if (bVar6 == false) {
              (*gl->beginTransformFeedback)(iterate::stages[lVar19].tf_mode);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glBeginTransformFeedback() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a1);
              (*gl->drawArrays)(iterate::stages[lVar19].draw_call_mode,0,
                                iterate::stages[lVar19].n_draw_call_vertices);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glDrawArrays() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a5);
              (*gl->endTransformFeedback)();
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glEndTransformFeedback() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a8);
              piVar17 = (int *)(*gl->mapBufferRange)(0x8c8e,0,4,1);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glMapBufferRange() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3ba);
              if (*piVar17 != local_378->gl_value) {
                clear_values._0_8_ =
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                pMVar21 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)clear_values,&local_378->name);
                poVar1 = &pMVar21->m_str;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," value [",8)
                ;
                std::ostream::operator<<(poVar1,*piVar17);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                           "] does not match the one reported by glGetIntegerv() [",0x36);
                std::ostream::operator<<(poVar1,local_378->gl_value);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
                tcu::MessageBuilder::operator<<
                          (pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                std::ios_base::~ios_base(local_180);
                pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar22,"GL constant value does not match the ES SL equivalent",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                           ,0x3c5);
LAB_0083bbdf:
                __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              if (*piVar17 < local_378->min_value) {
                clear_values._0_8_ =
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                pMVar21 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)clear_values,&local_378->name);
                poVar1 = &pMVar21->m_str;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," value [",8)
                ;
                std::ostream::operator<<(poVar1,*piVar17);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                           "] does not meet the minimum specification requirements [",0x38);
                std::ostream::operator<<(poVar1,local_378->min_value);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
                tcu::MessageBuilder::operator<<
                          (pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                std::ios_base::~ios_base(local_180);
                pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar22,
                           "GL constant value does not meet minimum specification requirements",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                           ,0x3d1);
                goto LAB_0083bbdf;
              }
              (*gl->unmapBuffer)(0x8c8e);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glUnmapBuffer() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3d5);
            }
            else {
              (*gl->dispatchCompute)(1,1,1);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glDispatchCompute() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3af);
            }
            bVar7 = true;
            do {
              bVar25 = bVar7;
              pGVar18 = pGVar12;
              if (bVar25) {
                pGVar18 = pGVar2;
              }
              if (!bVar25) {
                if (bVar8 == false) break;
LAB_0083b53e:
                result_value = 0;
                (*gl->framebufferTexture2D)(0x8ca8,0x8ce0,0xde1,*pGVar18,0);
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"glFramebufferTexture2D() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,1000);
                (*gl->finish)();
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"glMemoryBarrier() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,0x3ed);
                (*gl->readPixels)(0,0,1,1,0x8d94,0x1404,&result_value);
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"glReadPixels() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,0x3f4);
                if (result_value != local_378->gl_value) {
                  clear_values._0_8_ =
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                  pMVar21 = tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)clear_values,&local_378->name);
                  poVar1 = &pMVar21->m_str;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                             " value accessible to the compute / fragment shader [",0x34);
                  std::ostream::operator<<(poVar1,result_value);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                             "] does not match the one reported by glGetIntegerv() [",0x36);
                  std::ostream::operator<<(poVar1,local_378->gl_value);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
                  tcu::MessageBuilder::operator<<
                            (pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                  std::ios_base::~ios_base(local_180);
                  pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar22,"GL constant value does not match the ES SL equivalent",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                             ,0x400);
LAB_0083b9a8:
                  __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                }
                if (result_value < local_378->min_value) {
                  clear_values._0_8_ =
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                  pMVar21 = tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)clear_values,&local_378->name);
                  poVar1 = &pMVar21->m_str;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                             " value accessible to the compute / fragment shader [",0x34);
                  std::ostream::operator<<(poVar1,result_value);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                             "] does not meet the minimum specification requirements [",0x38);
                  std::ostream::operator<<(poVar1,local_378->min_value);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
                  tcu::MessageBuilder::operator<<
                            (pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                  std::ios_base::~ios_base(local_180);
                  pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar22,
                             "GL constant value does not meet minimum specification requirements",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                             ,0x40d);
                  goto LAB_0083b9a8;
                }
              }
              else if (bVar6 != false) goto LAB_0083b53e;
              bVar7 = false;
            } while (bVar25);
            (*gl->bufferSubData)(0x8c8e,0,0x40,"");
            GVar11 = (*gl->getError)();
            glu::checkError(GVar11,"glBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x416);
            clear_values[0] = 0;
            clear_values[1] = 0;
            clear_values[2] = 0;
            clear_values[3] = 0;
            (*gl->clearBufferiv)(0x1800,0,clear_values);
            pGVar18 = local_348;
            GVar11 = (*gl->getError)();
            glu::checkError(GVar11,"glClearBufferiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x41d);
            GVar4 = *pGVar18;
            if (GVar4 != 0) {
              (*gl->deleteProgram)(GVar4);
              *pGVar18 = 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vs_body._M_dataplus._M_p != &vs_body.field_2) {
              operator_delete(vs_body._M_dataplus._M_p,vs_body.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)te_body._M_dataplus._M_p != &te_body.field_2) {
              operator_delete(te_body._M_dataplus._M_p,te_body.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tc_body._M_dataplus._M_p != &tc_body.field_2) {
              operator_delete(tc_body._M_dataplus._M_p,tc_body.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)gs_body._M_dataplus._M_p != &gs_body.field_2) {
              operator_delete(gs_body._M_dataplus._M_p,gs_body.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fs_body._M_dataplus._M_p != &fs_body.field_2) {
              operator_delete(fs_body._M_dataplus._M_p,fs_body.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)cs_body._M_dataplus._M_p != &cs_body.field_2) {
              operator_delete(cs_body._M_dataplus._M_p,cs_body.field_2._M_allocated_capacity + 1);
            }
          }
LAB_0083b786:
          lVar19 = lVar19 + 1;
        } while (lVar19 != 5);
        local_378 = runs + 1;
        uVar20 = 0;
      } while ((local_350 & 1) != 0);
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar23 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_0083aa17;
    }
    clear_values._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(clear_values + 2);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"glGetIntegerv() returned error code ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"[",1);
    shader_bodies[0].body_ptr = (string *)glu::getErrorName;
    shader_bodies[0].gl_type = GVar11;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)shader_bodies,(ostream *)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "] for GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES query instead of GL_NO_ERROR",0x4a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)clear_values,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    clear_values._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(clear_values + 2);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"glGetIntegerv() returned error code ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"[",1);
    shader_bodies[0].body_ptr = (string *)glu::getErrorName;
    shader_bodies[0].gl_type = GVar11;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)shader_bodies,(ostream *)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"] for GL_MAX_CULL_DISTANCES query instead of GL_NO_ERROR",0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)clear_values,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
  std::ios_base::~ios_base(local_180);
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  pcVar23 = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_0083aa17:
  tcu::TestContext::setTestResult(this_01,testResult,pcVar23);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CullDistance::APICoverageTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if ARB_cull_distance is supported, or if
	 * we're running a GL4.5 context
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_cull_distance") &&
		!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)))
	{
		throw tcu::NotSupportedError("GL_ARB_cull_distance is not supported");
	}

	/* Check that calling GetIntegerv with MAX_CULL_DISTANCES doesn't generate
	 * any errors and returns a value at least 8.
	 *
	 * Check that calling GetIntegerv with MAX_COMBINED_CLIP_AND_CULL_DISTANCES
	 * doesn't generate any errors and returns a value at least 8.
	 *
	 */
	glw::GLint error_code									 = GL_NO_ERROR;
	glw::GLint gl_max_cull_distances_value					 = 0;
	glw::GLint gl_max_combined_clip_and_cull_distances_value = 0;

	gl.getIntegerv(GL_MAX_CULL_DISTANCES, &gl_max_cull_distances_value);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned error code "
						   << "[" << glu::getErrorStr(error_code) << "] for GL_MAX_CULL_DISTANCES"
																	 " query instead of GL_NO_ERROR"
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	gl.getIntegerv(GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES, &gl_max_combined_clip_and_cull_distances_value);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned error code "
						   << "[" << glu::getErrorStr(error_code) << "] for "
																	 "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES query "
																	 "instead of GL_NO_ERROR"
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	/* Before we proceed with the two other tests, initialize a buffer & a texture
	 * object we will need to capture data from the programs */
	static const glw::GLuint bo_size = sizeof(int) * 4 /* components */ * 4 /* result points */;

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.genFramebuffers(1, &m_fbo_draw_id);
	gl.genFramebuffers(1, &m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call(s) failed.");

	gl.genTextures(1, &m_cs_to_id);
	gl.genTextures(1, &m_fbo_draw_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() or glBindBufferBase() call(s) failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	for (glw::GLuint n_to_id = 0; n_to_id < 2; /* CS, FBO */ ++n_to_id)
	{
		gl.bindTexture(GL_TEXTURE_2D, (n_to_id == 0) ? m_cs_to_id : m_fbo_draw_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
						GL_R32I, 1,		  /* width */
						1);				  /* height */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");
	}

	gl.bindImageTexture(0,			   /* unit */
						m_cs_to_id, 0, /* level */
						GL_FALSE,	  /* layered */
						0,			   /* layer */
						GL_WRITE_ONLY, GL_R32I);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_fbo_draw_to_id, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.viewport(0,  /* x */
				0,  /* y */
				1,  /* width */
				1); /* height */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");

	/* There are two new GL constants, where value we need to verify */
	struct _run
	{
		const glw::GLchar* essl_token_value;
		glw::GLenum		   gl_enum;
		glw::GLint		   gl_value;
		glw::GLint		   min_value;
		const glw::GLchar* name;
	} runs[] = { { "gl_MaxCullDistances", GL_MAX_CULL_DISTANCES, gl_max_cull_distances_value, 8 /*minimum required */,
				   "GL_MAX_CULL_DISTANCES" },
				 { "gl_MaxCombinedClipAndCullDistances", GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES,
				   gl_max_combined_clip_and_cull_distances_value, 8 /*minimum required */,
				   "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES" } };

	static const glw::GLuint n_runs = sizeof(runs) / sizeof(runs[0]);

	for (glw::GLuint n_run = 0; n_run < n_runs; ++n_run)
	{
		_run& current_run = runs[n_run];

		static const struct _stage
		{
			bool use_cs;
			bool use_fs;
			bool use_gs;
			bool use_tc;
			bool use_te;
			bool use_vs;

			const glw::GLchar* fs_input;
			const glw::GLchar* gs_input;
			const glw::GLchar* tc_input;
			const glw::GLchar* te_input;

			const glw::GLchar* tf_output_name;
			const glw::GLenum  tf_mode;

			glw::GLenum draw_call_mode;
			glw::GLuint n_draw_call_vertices;
		} stages[] = { /* CS only test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   true, false, false, false, false, false,

						   NULL,	/* fs_input             */
						   NULL,	/* gs_input             */
						   NULL,	/* tc_input             */
						   NULL,	/* te_input             */
						   NULL,	/* tf_output_name       */
						   GL_NONE, /* tf_mode              */
						   GL_NONE, /* draw_call_mode       */
						   0,		/* n_draw_call_vertices */
					   },
					   /* VS+GS+TC+TE+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, true, true, true, true,

						   "out_gs",	 /* fs_input             */
						   "out_te",	 /* gs_input             */
						   "out_vs",	 /* tc_input             */
						   "out_tc",	 /* te_input             */
						   "out_gs",	 /* tf_output_name       */
						   GL_TRIANGLES, /* tf_mode              */
						   GL_PATCHES,   /* draw_call_mode       */
						   3,			 /* n_draw_call_vertices */
					   },
					   /* VS+GS+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, true, false, false, true,

						   "out_gs",	 /* fs_input             */
						   "out_vs",	 /* gs_input             */
						   NULL,		 /* tc_input             */
						   NULL,		 /* te_input             */
						   "out_gs",	 /* tf_output_name       */
						   GL_TRIANGLES, /* tf_mode              */
						   GL_POINTS,	/* draw_call_mode       */
						   1,			 /* n_draw_call_vertices */
					   },
					   /* VS+TC+TE+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, false, true, true, true,

						   "out_te",   /* fs_input             */
						   NULL,	   /* gs_input             */
						   "out_vs",   /* tc_input             */
						   "out_tc",   /* te_input             */
						   "out_te",   /* tf_output_name       */
						   GL_POINTS,  /* tf_mode              */
						   GL_PATCHES, /* draw_call_mode       */
						   3		   /* n_draw_call_vertices */
					   },
					   /* VS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, false, false, false, false, true,

						   "out_vs",  /* fs_input             */
						   NULL,	  /* gs_input             */
						   NULL,	  /* tc_input             */
						   NULL,	  /* te_input             */
						   "out_vs",  /* tf_output_name       */
						   GL_POINTS, /* tf_mode              */
						   GL_POINTS, /* draw_call_mode       */
						   1		  /* n_draw_call_vertices */
					   }
		};
		const glw::GLuint n_stages = sizeof(stages) / sizeof(stages[0]);

		/* Run through all test stages */
		for (glw::GLuint n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Check for OpenGL feature support */
			if (stages[n_stage].use_cs)
			{
				if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)) &&
					!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader"))
				{
					continue; // no compute shader support
				}
			}
			if (stages[n_stage].use_tc || stages[n_stage].use_te)
			{
				if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)) &&
					!m_context.getContextInfo().isExtensionSupported("GL_ARB_tessellation_shader"))
				{
					continue; // no tessellation shader support
				}
			}

			/* Check that use of the GLSL built-in constant gl_MaxCullDistance in any
			 * shader stage (including compute shader) does not affect the shader
			 * compilation & program linking process.
			 */
			static const glw::GLchar* cs_body_template =
				"#version 150\n"
				"\n"
				"#extension GL_ARB_compute_shader          : require\n"
				"#extension GL_ARB_cull_distance           : require\n"
				"#extension GL_ARB_shader_image_load_store : require\n"
				"\n"
				"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
				"\n"
				"layout(r32i) uniform writeonly iimage2D result;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    imageStore(result, ivec2(0),ivec4(TOKEN) );\n"
				"}\n";
			std::string cs_body = cs_body_template;

			static const glw::GLchar* fs_body_template = "#version 150\n"
														 "\n"
														 "#extension GL_ARB_cull_distance : require\n"
														 "\n"
														 "flat in  int INPUT_FS_NAME;\n"
														 "out int out_fs;\n"
														 "\n"
														 "void main()\n"
														 "{\n"
														 "    if (INPUT_FS_NAME == TOKEN)\n"
														 "    {\n"
														 "        out_fs = TOKEN;\n"
														 "    }\n"
														 "    else\n"
														 "    {\n"
														 "        out_fs = -1;\n"
														 "    }\n"
														 "}\n";
			std::string fs_body = fs_body_template;

			static const glw::GLchar* gs_body_template =
				"#version 150\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"flat in  int INPUT_GS_NAME[];\n"
				"flat out int out_gs;\n"
				"\n"
				"layout(points)                           in;\n"
				"layout(triangle_strip, max_vertices = 4) out;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_GS_NAME[0] == TOKEN) ? TOKEN : -1;\n"
				"\n"
				/* Draw a full-screen quad */
				"    gl_Position = vec4(-1.0, 1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(1.0, 1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(1.0, -1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"    EndPrimitive();\n"
				"}\n";
			std::string gs_body = gs_body_template;

			static const glw::GLchar* tc_body_template =
				"#version 400\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"layout(vertices = 1) out;\n"
				"\n"
				"flat in  int INPUT_TC_NAME[];\n"
				"flat out int out_tc       [];\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_TC_NAME[0] == TOKEN) ? TOKEN : -1;\n"
				"\n"
				"    out_tc[gl_InvocationID]             = result_value;\n"
				"    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
				"    gl_TessLevelInner[0]                = 1.0;\n"
				"    gl_TessLevelInner[1]                = 1.0;\n"
				"    gl_TessLevelOuter[0]                = 1.0;\n"
				"    gl_TessLevelOuter[1]                = 1.0;\n"
				"    gl_TessLevelOuter[2]                = 1.0;\n"
				"    gl_TessLevelOuter[3]                = 1.0;\n"
				"}\n";
			std::string tc_body = tc_body_template;

			static const glw::GLchar* te_body_template =
				"#version 400\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"flat in  int INPUT_TE_NAME[];\n"
				"flat out int out_te;\n"
				"\n"
				"layout(isolines, point_mode) in;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_TE_NAME[0] == TOKEN) ? TOKEN : 0;\n"
				"\n"
				"    out_te = result_value;\n"
				"\n"
				"    gl_Position = vec4(0.0, 0.0, 0.0, 1.);\n"
				"}\n";
			std::string te_body = te_body_template;

			static const glw::GLchar* vs_body_template = "#version 150\n"
														 "\n"
														 "#extension GL_ARB_cull_distance : require\n"
														 "\n"
														 "flat out int out_vs;\n"
														 "\n"
														 "void main()\n"
														 "{\n"
														 "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
														 "    out_vs      = TOKEN;\n"
														 "}\n";
			std::string vs_body = vs_body_template;

			const _stage& current_stage = stages[n_stage];

			/* Build shader bodies */
			struct _shader_body
			{
				std::string* body_ptr;
				glw::GLenum  gl_type;
			} shader_bodies[] = { { &cs_body, GL_COMPUTE_SHADER },		   { &fs_body, GL_FRAGMENT_SHADER },
								  { &gs_body, GL_GEOMETRY_SHADER },		   { &tc_body, GL_TESS_CONTROL_SHADER },
								  { &te_body, GL_TESS_EVALUATION_SHADER }, { &vs_body, GL_VERTEX_SHADER } };
			static const glw::GLchar* input_fs_token_string = "INPUT_FS_NAME";
			static const glw::GLchar* input_gs_token_string = "INPUT_GS_NAME";
			static const glw::GLchar* input_te_token_string = "INPUT_TE_NAME";
			static const glw::GLchar* input_tc_token_string = "INPUT_TC_NAME";
			static const glw::GLuint  n_shader_bodies		= sizeof(shader_bodies) / sizeof(shader_bodies[0]);

			std::size_t				  token_position = std::string::npos;
			static const glw::GLchar* token_string   = "TOKEN";

			for (glw::GLuint n_shader_body = 0; n_shader_body < n_shader_bodies; ++n_shader_body)
			{
				_shader_body& current_body = shader_bodies[n_shader_body];

				/* Is this stage actually used? */
				if (((current_body.gl_type == GL_COMPUTE_SHADER) && (!current_stage.use_cs)) ||
					((current_body.gl_type == GL_FRAGMENT_SHADER) && (!current_stage.use_fs)) ||
					((current_body.gl_type == GL_TESS_CONTROL_SHADER) && (!current_stage.use_tc)) ||
					((current_body.gl_type == GL_TESS_EVALUATION_SHADER) && (!current_stage.use_te)) ||
					((current_body.gl_type == GL_VERTEX_SHADER) && (!current_stage.use_vs)))
				{
					/* Skip the iteration. */
					continue;
				}

				/* Iterate over all token and replace them with stage-specific values */
				struct _token_value_pair
				{
					const glw::GLchar* token;
					const glw::GLchar* value;
				} token_value_pairs[] = {
					/* NOTE: The last entry is filled by the switch() block below */
					{ token_string, current_run.essl_token_value },
					{ NULL, NULL },
				};

				const size_t n_token_value_pairs = sizeof(token_value_pairs) / sizeof(token_value_pairs[0]);

				switch (current_body.gl_type)
				{
				case GL_COMPUTE_SHADER:
				case GL_VERTEX_SHADER:
					break;

				case GL_FRAGMENT_SHADER:
				{
					token_value_pairs[1].token = input_fs_token_string;
					token_value_pairs[1].value = current_stage.fs_input;

					break;
				}

				case GL_GEOMETRY_SHADER:
				{
					token_value_pairs[1].token = input_gs_token_string;
					token_value_pairs[1].value = current_stage.gs_input;

					break;
				}

				case GL_TESS_CONTROL_SHADER:
				{
					token_value_pairs[1].token = input_tc_token_string;
					token_value_pairs[1].value = current_stage.tc_input;

					break;
				}

				case GL_TESS_EVALUATION_SHADER:
				{
					token_value_pairs[1].token = input_te_token_string;
					token_value_pairs[1].value = current_stage.te_input;

					break;
				}

				default:
					TCU_FAIL("Unrecognized shader body type");
				}

				for (glw::GLuint n_pair = 0; n_pair < n_token_value_pairs; ++n_pair)
				{
					const _token_value_pair& current_pair = token_value_pairs[n_pair];

					if (current_pair.token == NULL || current_pair.value == NULL)
					{
						continue;
					}

					while ((token_position = current_body.body_ptr->find(current_pair.token)) != std::string::npos)
					{
						current_body.body_ptr->replace(token_position, strlen(current_pair.token), current_pair.value);
					}
				} /* for (all token+value pairs) */
			}	 /* for (all sader bodies) */

			/* Build the test program */
			CullDistance::Utilities::buildProgram(
				gl, m_testCtx, current_stage.use_cs ? cs_body.c_str() : DE_NULL,
				current_stage.use_fs ? fs_body.c_str() : DE_NULL, current_stage.use_gs ? gs_body.c_str() : DE_NULL,
				current_stage.use_tc ? tc_body.c_str() : DE_NULL, current_stage.use_te ? te_body.c_str() : DE_NULL,
				current_stage.use_vs ? vs_body.c_str() : DE_NULL, (current_stage.tf_output_name != NULL) ? 1 : 0,
				(const glw::GLchar**)&current_stage.tf_output_name, &m_po_id);

			/* Bind the test program */
			DE_ASSERT(m_po_id != 0);

			gl.useProgram(m_po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			/* Execute the draw call. Transform Feed-back should be enabled for all iterations
			 * par the CS one, since we use a different tool to capture the result data in the
			 * latter case.
			 */
			if (!current_stage.use_cs)
			{
				gl.beginTransformFeedback(current_stage.tf_mode);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

				gl.drawArrays(current_stage.draw_call_mode, 0,	 /* first */
							  current_stage.n_draw_call_vertices); /* count */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

				gl.endTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");
			} /* if (uses_tf) */
			else
			{
				gl.dispatchCompute(1,  /* num_groups_x */
								   1,  /* num_groups_y */
								   1); /* num_groups_z */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() call failed.");
			}

			/* Verify the result values */
			if (!current_stage.use_cs)
			{
				glw::GLint* result_data_ptr = DE_NULL;

				/* Retrieve the data captured by Transform Feedback */
				result_data_ptr = (glw::GLint*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																 sizeof(unsigned int) * 1, GL_MAP_READ_BIT);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

				if (*result_data_ptr != current_run.gl_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name << " value "
																					   "["
									   << *result_data_ptr << "]"
															  " does not match the one reported by glGetIntegerv() "
															  "["
									   << current_run.gl_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not match the ES SL equivalent");
				}

				if (*result_data_ptr < current_run.min_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name << " value "
																					   "["
									   << *result_data_ptr << "]"
															  " does not meet the minimum specification requirements "
															  "["
									   << current_run.min_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not meet minimum specification requirements");
				}

				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
			}

			for (glw::GLuint n_stage_internal = 0; n_stage_internal < 2; /* CS, FS write to separate textures */
				 ++n_stage_internal)
			{
				glw::GLuint to_id = (n_stage_internal == 0) ? m_cs_to_id : m_fbo_draw_to_id;

				if (((n_stage_internal == 0) && (!current_stage.use_cs)) ||
					((n_stage_internal == 1) && (!current_stage.use_fs)))
				{
					/* Skip the iteration */
					continue;
				}

				/* Check the image data the test CS / FS should have written */
				glw::GLint result_value = 0;

				gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, to_id, 0); /* level */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

				/* NOTE: We're using our custom read framebuffer here, so we'll be reading
				 *       from the texture, that the writes have been issued to earlier. */
				gl.finish();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier() call failed.");

				gl.readPixels(0, /* x */
							  0, /* y */
							  1, /* width */
							  1, /* height */
							  GL_RED_INTEGER, GL_INT, &result_value);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

				if (result_value != current_run.gl_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name
									   << " value accessible to the compute / fragment shader "
										  "["
									   << result_value << "]"
														  " does not match the one reported by glGetIntegerv() "
														  "["
									   << current_run.gl_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not match the ES SL equivalent");
				}

				if (result_value < current_run.min_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name
									   << " value accessible to the compute / fragment shader "
										  "["
									   << result_value << "]"
														  " does not meet the minimum specification requirements "
														  "["
									   << current_run.min_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not meet minimum specification requirements");
				}
			}

			/* Clear the data buffer before we continue */
			static const glw::GLubyte bo_clear_data[bo_size] = { 0 };

			gl.bufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
							 bo_size, bo_clear_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			/* Clear the texture mip-map before we continue */
			glw::GLint clear_values[4] = { 0, 0, 0, 0 };

			gl.clearBufferiv(GL_COLOR, 0, /* drawbuffer */
							 clear_values);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClearBufferiv() call failed.");

			/* Release program before we move on to the next iteration */
			if (m_po_id != 0)
			{
				gl.deleteProgram(m_po_id);

				m_po_id = 0;
			}
		} /* for (all stages) */
	}	 /* for (both runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}